

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  TimeInMillis ms;
  TimeInMillis ms_00;
  _Alloc_hider _Var6;
  char *pcVar7;
  undefined1 local_b8 [8];
  string kTestsuite;
  string kIndent;
  long local_68;
  string local_58;
  allocator<char> local_31;
  
  local_b8 = (undefined1  [8])&kTestsuite._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"testcase","");
  kTestsuite.field_2._8_8_ = &kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)((long)&kTestsuite.field_2 + 8),'\n');
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\b');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kIndent.field_2._M_local_buf + 8),(test_info->name_)._M_dataplus._M_p,
             &local_31);
  OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuite.field_2 + 8),true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value_param","");
    pbVar2 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var6._M_p = (char *)0x0;
    }
    else {
      _Var6._M_p = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),_Var6._M_p,&local_31);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar2 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"type_param","");
    pbVar2 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var6._M_p = (char *)0x0;
    }
    else {
      _Var6._M_p = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),_Var6._M_p,&local_31);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"file","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),
               (test_info->location_).file._M_dataplus._M_p,&local_31);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"line","");
    OutputJsonKey(stream,(string *)local_b8,&local_58,(test_info->location_).line,
                  (string *)((long)&kTestsuite.field_2 + 8),false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_58,'\b');
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"status","");
    pcVar7 = "NOTRUN";
    if ((ulong)test_info->should_run_ != 0) {
      pcVar7 = "RUN";
    }
    kIndent.field_2._8_8_ = &stack0xffffffffffffff98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&kIndent.field_2 + 8),pcVar7,
               pcVar7 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"result","");
    this = &test_info->result_;
    if (test_info->should_run_ == true) {
      bVar3 = TestResult::Skipped(this);
      pcVar7 = "COMPLETED";
      if (bVar3) {
        pcVar7 = "SKIPPED";
      }
    }
    else {
      pcVar7 = "SUPPRESSED";
    }
    kIndent.field_2._8_8_ = &stack0xffffffffffffff98;
    sVar5 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&kIndent.field_2 + 8),pcVar7,pcVar7 + sVar5);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              ((string *)((long)&kIndent.field_2 + 8),
               (internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_
              ((string *)((long)&kIndent.field_2 + 8),(internal *)(test_info->result_).elapsed_time_
               ,ms_00);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),true);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"classname","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kIndent.field_2._M_local_buf + 8),test_suite_name,&local_31);
    OutputJsonKey(stream,(string *)local_b8,&local_58,(string *)((long)&kIndent.field_2 + 8),
                  (string *)((long)&kTestsuite.field_2 + 8),false);
    if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kIndent.field_2._8_8_,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    TestPropertiesAsJson(&local_58,this,(string *)((long)&kTestsuite.field_2 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    OutputJsonTestResult(stream,this);
  }
  if ((size_type *)kTestsuite.field_2._8_8_ != &kIndent._M_string_length) {
    operator_delete((void *)kTestsuite.field_2._8_8_,kIndent._M_string_length + 1);
  }
  if (local_b8 != (undefined1  [8])&kTestsuite._M_string_length) {
    operator_delete((void *)local_b8,kTestsuite._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  OutputJsonTestResult(stream, result);
}